

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O2

string * Vault::Base64::decode(string *__return_storage_ptr__,string *encoded_string)

{
  uchar uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  string base64_chars;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&base64_chars,
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",
             (allocator<char> *)char_array_4);
  iVar4 = (int)encoded_string->_M_string_length;
  char_array_4[0] = '\0';
  char_array_4[1] = '\0';
  char_array_4[2] = '\0';
  char_array_4[3] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  lVar3 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = 0;
  while( true ) {
    lVar5 = (long)iVar2;
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if ((bVar7) || (uVar1 = (encoded_string->_M_dataplus)._M_p[lVar3], uVar1 == '=')) break;
    bVar7 = is_base64(uVar1);
    if (!bVar7) break;
    iVar2 = iVar2 + 1;
    char_array_4[lVar5] = uVar1;
    lVar3 = lVar3 + 1;
    if (iVar2 == 4) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        uVar1 = std::__cxx11::string::find
                          ((char)&base64_chars,(ulong)(uint)(int)(char)char_array_4[lVar5]);
        char_array_4[lVar5] = uVar1;
      }
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      iVar2 = 0;
    }
  }
  if (iVar2 != 0) {
    for (; lVar5 < 4; lVar5 = lVar5 + 1) {
      char_array_4[lVar5] = '\0';
    }
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      uVar1 = std::__cxx11::string::find
                        ((char)&base64_chars,(ulong)(uint)(int)(char)char_array_4[lVar3]);
      char_array_4[lVar3] = uVar1;
    }
    iVar4 = 1;
    if (1 < iVar2) {
      iVar4 = iVar2;
    }
    for (uVar6 = 0; iVar4 - 1 != uVar6; uVar6 = uVar6 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&base64_chars);
  return __return_storage_ptr__;
}

Assistant:

std::string Vault::Base64::decode(std::string const &encoded_string) {
  std::string base64_chars =
      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
  int in_len = encoded_string.size();
  int i = 0;
  int j = 0;
  int in_ = 0;
  unsigned char char_array_4[4] = {0};
  unsigned char char_array_3[3] = {0};
  std::string ret;

  while (in_len-- && (encoded_string[in_] != '=') &&
         is_base64(encoded_string[in_])) {
    char_array_4[i++] = encoded_string[in_];
    in_++;
    if (i == 4) {
      for (i = 0; i < 4; i++) {
        char_array_4[i] = base64_chars.find(char_array_4[i]);
      }

      char_array_3[0] =
          (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
      char_array_3[1] =
          ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
      char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

      for (i = 0; (i < 3); i++) {
        ret += char_array_3[i];
      }

      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 4; j++) {
      char_array_4[j] = 0;
    }

    for (j = 0; j < 4; j++) {
      char_array_4[j] = base64_chars.find(char_array_4[j]);
    }

    char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
    char_array_3[1] =
        ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
    char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

    for (j = 0; (j < i - 1); j++) {
      ret += char_array_3[j];
    }
  }

  return ret;
}